

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

reference __thiscall
absl::lts_20240722::container_internal::
btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
::operator*(btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
            *this)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  char *__function;
  btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
  *this_00;
  
  this_00 = (btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
             *)this->node_;
  if (this_00 ==
      (btree_iterator<const_absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_&,_const_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_*>
       *)0x0) {
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
                 *)0x0);
LAB_0023e900:
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
                 *)this_00);
LAB_0023e905:
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
                 *)this_00);
LAB_0023e90a:
    btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
    ::operator*((btree_iterator<absl::lts_20240722::container_internal::btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,256,false>>const,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const&,google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry_const*>
                 *)this_00);
  }
  else {
    iVar1 = this->position_;
    bVar2 = btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
            ::start((btree_node<absl::lts_20240722::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry,_google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare,_std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>,_256,_false>_>
                     *)this_00);
    if (iVar1 < (int)(uint)bVar2) goto LAB_0023e900;
    if (((ulong)this->node_ & 7) == 0) {
      if (this->position_ < (int)(uint)(byte)this->node_[10]) {
LAB_0023e8dd:
        if (((ulong)this->node_ & 7) == 0) {
          return (reference)(this->node_ + (ulong)(byte)this->position_ * 0x28 + 0x10);
        }
        __function = 
        "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, Offset..." /* TRUNCATED STRING LITERAL */
        ;
        goto LAB_0023e93b;
      }
      this_00 = this;
      bVar3 = IsEndIterator(this);
      if (bVar3) goto LAB_0023e905;
      if (((ulong)this->node_ & 7) != 0) goto LAB_0023e90f;
      if (this->position_ < (int)(uint)(byte)this->node_[10]) goto LAB_0023e8dd;
      goto LAB_0023e90a;
    }
  }
LAB_0023e90f:
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, std::integer_sequence<unsigned long>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *, unsigned int, unsigned char, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, absl::container_internal::btree_node<absl::container_internal::set_params<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry, google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileCompare, std::allocator<google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::FileEntry>, 256, false>> *>, StaticSizeSeq = std::integer_sequence<unsigned long, 1, 0, 4, 6, 7>, RuntimeSizeSeq = std::integer_sequence<unsigned long>, SizeSeq = std::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, Offset..." /* TRUNCATED STRING LITERAL */
  ;
LAB_0023e93b:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/absl-src/absl/container/internal/layout.h"
                ,0x1fe,__function);
}

Assistant:

reference operator*() const {
    ABSL_HARDENING_ASSERT(node_ != nullptr);
    assert_valid_generation(node_);
    ABSL_HARDENING_ASSERT(position_ >= node_->start());
    if (position_ >= node_->finish()) {
      ABSL_HARDENING_ASSERT(!IsEndIterator() && "Dereferencing end() iterator");
      ABSL_HARDENING_ASSERT(position_ < node_->finish());
    }
    return node_->value(static_cast<field_type>(position_));
  }